

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qobject.cpp
# Opt level: O2

bool __thiscall QObject::doSetProperty(QObject *this,char *name,QVariant *lvalue,QVariant *rvalue)

{
  QObjectPrivate *this_00;
  ExtraData *this_01;
  bool bVar1;
  undefined1 uVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  undefined4 extraout_var;
  ssize_t sVar6;
  qsizetype qVar7;
  pointer pQVar8;
  QVariant *pQVar9;
  size_t __n;
  QList<QVariant> *this_03;
  long in_FS_OFFSET;
  QArrayDataPointer<char> local_80;
  QDynamicPropertyChangeEvent ev;
  char *name_local;
  long local_38;
  QMetaObject *this_02;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = (QObjectPrivate *)(this->d_ptr).d;
  pQVar9 = rvalue;
  name_local = name;
  iVar3 = (**this->_vptr_QObject)();
  this_02 = (QMetaObject *)CONCAT44(extraout_var,iVar3);
  __n = CONCAT71((int7)((ulong)pQVar9 >> 8),this_02 == (QMetaObject *)0x0 || name == (char *)0x0);
  if (this_02 != (QMetaObject *)0x0 && name != (char *)0x0) {
    iVar3 = QMetaObject::indexOfProperty(this_02,name);
    if (-1 < iVar3) {
      ev.n.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
      ev.n.d.ptr = &DAT_aaaaaaaaaaaaaaaa;
      ev.super_QEvent._vptr_QEvent = (_func_int **)&DAT_aaaaaaaaaaaaaaaa;
      ev.super_QEvent._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
      QMetaObject::property((QMetaProperty *)&ev,this_02,iVar3);
      if (rvalue == (QVariant *)0x0) {
        sVar6 = QMetaProperty::write((QMetaProperty *)&ev,(int)this,lvalue,__n);
        uVar2 = (undefined1)sVar6;
      }
      else {
        sVar6 = QMetaProperty::write((QMetaProperty *)&ev,(int)this,rvalue,__n);
        uVar2 = (undefined1)sVar6;
      }
      goto LAB_0028eb96;
    }
    QObjectPrivate::ensureExtraData(this_00);
    qVar7 = QtPrivate::indexOf<QByteArray,char_const*>
                      (&this_00->extraData->propertyNames,&name_local,0);
    iVar3 = (int)qVar7;
    if (*(ulong *)&(lvalue->d).field_0x18 < 4) {
      if (iVar3 == -1) goto LAB_0028eb94;
      QList<QByteArray>::removeAt(&this_00->extraData->propertyNames,(long)iVar3);
      QList<QVariant>::removeAt(&this_00->extraData->propertyValues,(long)iVar3);
    }
    else if (iVar3 == -1) {
      this_01 = this_00->extraData;
      QByteArray::QByteArray((QByteArray *)&ev,name_local,-1);
      QList<QByteArray>::emplaceBack<QByteArray>(&this_01->propertyNames,(QByteArray *)&ev);
      QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)&ev);
      this_03 = &this_00->extraData->propertyValues;
      if (rvalue == (QVariant *)0x0) {
        QList<QVariant>::emplaceBack<QVariant_const&>(this_03,lvalue);
      }
      else {
        QList<QVariant>::emplaceBack<QVariant>(this_03,rvalue);
      }
    }
    else {
      iVar4 = ::QVariant::typeId(lvalue);
      iVar5 = ::QVariant::typeId((this_00->extraData->propertyValues).d.ptr + iVar3);
      if ((iVar4 == iVar5) &&
         (bVar1 = ::QVariant::equals(lvalue,(this_00->extraData->propertyValues).d.ptr + iVar3),
         bVar1)) goto LAB_0028eb94;
      pQVar8 = QList<QVariant>::data(&this_00->extraData->propertyValues);
      if (rvalue == (QVariant *)0x0) {
        ::QVariant::operator=(pQVar8 + iVar3,lvalue);
      }
      else {
        ::QVariant::operator=(pQVar8 + iVar3,rvalue);
      }
    }
    ev.n.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    ev.n.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    ev.n.d.ptr = &DAT_aaaaaaaaaaaaaaaa;
    ev.super_QEvent._vptr_QEvent = (_func_int **)&DAT_aaaaaaaaaaaaaaaa;
    ev.super_QEvent._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
    QByteArray::QByteArray((QByteArray *)&local_80,name_local,-1);
    QDynamicPropertyChangeEvent::QDynamicPropertyChangeEvent(&ev,(QByteArray *)&local_80);
    QArrayDataPointer<char>::~QArrayDataPointer(&local_80);
    QCoreApplication::sendEvent(this,&ev.super_QEvent);
    QDynamicPropertyChangeEvent::~QDynamicPropertyChangeEvent(&ev);
  }
LAB_0028eb94:
  uVar2 = 0;
LAB_0028eb96:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return (bool)uVar2;
}

Assistant:

bool QObject::doSetProperty(const char *name, const QVariant *lvalue, QVariant *rvalue)
{
    Q_D(QObject);
    const auto &value =*lvalue;
    const QMetaObject *meta = metaObject();
    if (!name || !meta)
        return false;

    int id = meta->indexOfProperty(name);
    if (id < 0) {
        d->ensureExtraData();

        const int idx = d->extraData->propertyNames.indexOf(name);

        if (!value.isValid()) {
            if (idx == -1)
                return false;
            d->extraData->propertyNames.removeAt(idx);
            d->extraData->propertyValues.removeAt(idx);
        } else {
            if (idx == -1) {
                d->extraData->propertyNames.append(name);
                if (rvalue)
                    d->extraData->propertyValues.append(std::move(*rvalue));
                else
                    d->extraData->propertyValues.append(*lvalue);
            } else {
                if (value.userType() == d->extraData->propertyValues.at(idx).userType()
                        && value == d->extraData->propertyValues.at(idx))
                    return false;
                if (rvalue)
                    d->extraData->propertyValues[idx] = std::move(*rvalue);
                else
                    d->extraData->propertyValues[idx] = *lvalue;
            }
        }

        QDynamicPropertyChangeEvent ev(name);
        QCoreApplication::sendEvent(this, &ev);

        return false;
    }
    QMetaProperty p = meta->property(id);
#ifndef QT_NO_DEBUG
    if (!p.isWritable())
        qWarning("%s::setProperty: Property \"%s\" invalid,"
                 " read-only or does not exist", metaObject()->className(), name);
#endif
    return rvalue ? p.write(this, std::move(*rvalue)) : p.write(this, *lvalue);
}